

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAxis2Placement2D::IfcAxis2Placement2D(IfcAxis2Placement2D *this)

{
  *(undefined ***)&this->field_0x58 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(char **)&this->field_0x68 = "IfcAxis2Placement2D";
  IfcPlacement::IfcPlacement(&this->super_IfcPlacement,&PTR_construction_vtable_24__007ac600);
  *(undefined8 *)&(this->super_IfcPlacement).field_0x40 = 0;
  *(undefined8 *)&(this->super_IfcPlacement).field_0x48 = 0;
  (this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7ac548;
  *(undefined8 *)&this->field_0x58 = 0x7ac5e8;
  *(undefined8 *)
   &(this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7ac570;
  *(undefined8 *)
   &(this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7ac598;
  *(undefined8 *)&(this->super_IfcPlacement).field_0x38 = 0x7ac5c0;
  this->field_0x50 = 0;
  return;
}

Assistant:

IfcAxis2Placement2D() : Object("IfcAxis2Placement2D") {}